

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O0

void __thiscall trng::mrg5s::split(mrg5s *this,uint s,uint n)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t m;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint in_EDX;
  uint in_ESI;
  int32_t *in_RDI;
  int i;
  int32_t b [25];
  int32_t a [5];
  int32_t q9;
  int32_t q8;
  int32_t q7;
  int32_t q6;
  int32_t q5;
  int32_t q4;
  int32_t q3;
  int32_t q2;
  int32_t q1;
  int32_t q0;
  invalid_argument *this_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar10;
  int32_t iVar11;
  int32_t iVar12;
  undefined4 in_stack_ffffffffffffff8c;
  int32_t (*in_stack_ffffffffffffff90) [25];
  invalid_argument local_20 [20];
  uint local_c;
  
  local_c = in_ESI;
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    this_00 = local_20;
    std::invalid_argument::invalid_argument(this_00,"invalid argument for trng::mrg5s::split");
    utility::throw_this<std::invalid_argument>(this_00);
    std::invalid_argument::~invalid_argument(local_20);
  }
  if (1 < local_c) {
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar1 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar2 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar3 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar4 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar5 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    m = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar6 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar7 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar8 = in_RDI[5];
    jump((mrg5s *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
         (unsigned_long_long)in_RDI);
    iVar9 = in_RDI[5];
    iVar11 = iVar5;
    iVar12 = iVar4;
    int_math::gauss<5>(in_stack_ffffffffffffff90,
                       (int32_t (*) [5])CONCAT44(in_stack_ffffffffffffff8c,iVar5),m);
    *in_RDI = m;
    in_RDI[1] = iVar6;
    in_RDI[2] = iVar7;
    in_RDI[3] = iVar8;
    in_RDI[4] = iVar9;
    in_RDI[5] = iVar5;
    in_RDI[6] = iVar4;
    in_RDI[7] = iVar3;
    in_RDI[8] = iVar2;
    in_RDI[9] = iVar1;
    for (iVar10 = 0; iVar10 < 5; iVar10 = iVar10 + 1) {
      backward((mrg5s *)CONCAT44(iVar12,iVar11));
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::mrg5s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }